

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O1

json_t * get_root_option_json_object(char *json_string)

{
  json_t *pjVar1;
  json_error_t error;
  json_t *local_110;
  json_error_t local_104;
  
  pjVar1 = json_loads(json_string,0,&local_104);
  if (pjVar1 == (json_t *)0x0) {
    get_root_option_json_object_cold_2();
    pjVar1 = (json_t *)0x0;
  }
  else if (pjVar1->type != JSON_OBJECT) {
    get_root_option_json_object_cold_1();
    pjVar1 = local_110;
  }
  return pjVar1;
}

Assistant:

json_t * get_root_option_json_object(const char * json_string)
{
	json_t * root;
	json_error_t error;

	root = json_loads(json_string, 0, &error);
	if (!root)
	{
		fprintf(stderr, "json error in options: on line %d: %s\n", error.line, error.text);
		return NULL;
	}

	if (!json_is_object(root))
	{
		fprintf(stderr, "json error in options: root is not an object\n");
		json_decref(root);
		return NULL;
	}

	return root;
}